

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Branch * __thiscall
kj::_::NullableValue<kj::(anonymous_namespace)::AsyncTee::Branch>::
emplace<kj::(anonymous_namespace)::AsyncTee::Branch>
          (NullableValue<kj::(anonymous_namespace)::AsyncTee::Branch> *this,Branch *params)

{
  Branch *params_00;
  Branch *params_local;
  NullableValue<kj::(anonymous_namespace)::AsyncTee::Branch> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::(anonymous_namespace)::AsyncTee::Branch>(&(this->field_1).value);
  }
  params_00 = fwd<kj::(anonymous_namespace)::AsyncTee::Branch>(params);
  ctor<kj::(anonymous_namespace)::AsyncTee::Branch,kj::(anonymous_namespace)::AsyncTee::Branch>
            (&(this->field_1).value,params_00);
  this->isSet = true;
  return (Branch *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }